

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O2

Gls_Man_t * Gls_ManAlloc(Vec_Str_t *vLines,int *pCounts)

{
  Gls_Man_t *pGVar1;
  Vec_Str_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  Vec_Wec_t *pVVar6;
  int iVar7;
  int iVar8;
  size_t __n;
  long lVar9;
  
  pGVar1 = (Gls_Man_t *)calloc(1,0x88);
  pGVar1->vLines = vLines;
  __n = (long)vLines->nSize + 100;
  iVar8 = (int)__n;
  pVVar2 = Vec_StrAlloc(iVar8);
  pVVar2->nSize = iVar8;
  memset(pVVar2->pArray,0,__n);
  pGVar1->vTypes = pVVar2;
  lVar9 = (long)vLines->nSize + 100;
  iVar8 = (int)lVar9;
  pVVar3 = Vec_IntAlloc(iVar8);
  pVVar3->nSize = iVar8;
  if (pVVar3->pArray != (int *)0x0) {
    memset(pVVar3->pArray,0,lVar9 * 4);
  }
  pGVar1->vIndexes = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[7] << 2);
  pGVar1->vLut4s = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[7]);
  pGVar1->vLut4TTs = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[8] * 6);
  pGVar1->vLut6s = pVVar3;
  iVar8 = pCounts[8];
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar7 = iVar8;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar7 << 3);
  }
  pVVar4->pArray = pwVar5;
  pGVar1->vLut6TTs = pVVar4;
  pVVar3 = Vec_IntAlloc(pCounts[9] * 5);
  pGVar1->vBoxes = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[10]);
  pGVar1->vDelays = pVVar3;
  pVVar6 = Vec_WecAlloc(pCounts[10]);
  pGVar1->vDelayIns = pVVar6;
  pVVar6 = Vec_WecAlloc(pCounts[10]);
  pGVar1->vDelayOuts = pVVar6;
  pVVar3 = Vec_IntAlloc(pCounts[2]);
  pGVar1->vOrderPis = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[3]);
  pGVar1->vOrderPos = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[9]);
  pGVar1->vOrderBoxes = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[10]);
  pGVar1->vOrderDelays = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[8] + pCounts[7] + pCounts[4] * 2);
  pGVar1->vOrderLuts = pVVar3;
  pVVar3 = Vec_IntAlloc(pCounts[5]);
  pGVar1->vOrderSeqs = pVVar3;
  return pGVar1;
}

Assistant:

Gls_Man_t * Gls_ManAlloc( Vec_Str_t * vLines, int * pCounts )
{
    Gls_Man_t * p = ABC_CALLOC( Gls_Man_t, 1 );
    p->vLines     = vLines;
    p->vTypes     = Vec_StrStart( Vec_StrSize(vLines)+100 ); 
    p->vIndexes   = Vec_IntStart( Vec_StrSize(vLines)+100 ); 
    p->vLut4s     = Vec_IntAlloc( 4 * pCounts[GLS_LUT4] );
    p->vLut4TTs   = Vec_IntAlloc( pCounts[GLS_LUT4] );
    p->vLut6s     = Vec_IntAlloc( 6 * pCounts[GLS_LUT6] );
    p->vLut6TTs   = Vec_WrdAlloc( pCounts[GLS_LUT6] );
    p->vBoxes     = Vec_IntAlloc( 5 * pCounts[GLS_BOX] );
    p->vDelays    = Vec_IntAlloc( pCounts[GLS_DEL] );
    p->vDelayIns  = Vec_WecAlloc( pCounts[GLS_DEL] );
    p->vDelayOuts = Vec_WecAlloc( pCounts[GLS_DEL] );
    // ordering
    p->vOrderPis    = Vec_IntAlloc( pCounts[GLS_PI] );
    p->vOrderPos    = Vec_IntAlloc( pCounts[GLS_PO] );
    p->vOrderBoxes  = Vec_IntAlloc( pCounts[GLS_BOX] );
    p->vOrderDelays = Vec_IntAlloc( pCounts[GLS_DEL] );
    p->vOrderLuts   = Vec_IntAlloc( pCounts[GLS_LUT4] + pCounts[GLS_LUT6] + 2*pCounts[GLS_BAR] );
    p->vOrderSeqs   = Vec_IntAlloc( pCounts[GLS_SEQ] );
    return p;
}